

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Geometry.cpp
# Opt level: O0

bool __thiscall
amrex::Geometry::outsideRoundoffDomain(Geometry *this,ParticleReal x,ParticleReal y,ParticleReal z)

{
  long in_RDI;
  double in_XMM0_Qa;
  Real RVar1;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  bool outside;
  undefined1 local_52;
  
  RVar1 = RealBox::lo((RealBox *)(in_RDI + 0x58),0);
  local_52 = true;
  if (RVar1 <= in_XMM0_Qa) {
    local_52 = true;
    if (in_XMM0_Qa < *(double *)(in_RDI + 0x88)) {
      RVar1 = RealBox::lo((RealBox *)(in_RDI + 0x58),1);
      local_52 = true;
      if (RVar1 <= in_XMM1_Qa) {
        local_52 = true;
        if (in_XMM1_Qa < *(double *)(in_RDI + 0x90)) {
          RVar1 = RealBox::lo((RealBox *)(in_RDI + 0x58),2);
          local_52 = true;
          if (RVar1 <= in_XMM2_Qa) {
            local_52 = *(double *)(in_RDI + 0x98) <= in_XMM2_Qa;
          }
        }
      }
    }
  }
  return local_52;
}

Assistant:

bool
Geometry::outsideRoundoffDomain (AMREX_D_DECL(ParticleReal x, ParticleReal y, ParticleReal z)) const
{
#ifdef AMREX_SINGLE_PRECISION_PARTICLES
    bool outside = AMREX_D_TERM(x <  prob_domain.lo(0)
                             || x >= roundoff_hi_f[0],
                             || y <  prob_domain.lo(1)
                             || y >= roundoff_hi_f[1],
                             || z <  prob_domain.lo(2)
                             || z >= roundoff_hi_f[2]);
#else
    bool outside = AMREX_D_TERM(x <  prob_domain.lo(0)
                             || x >= roundoff_hi_d[0],
                             || y <  prob_domain.lo(1)
                             || y >= roundoff_hi_d[1],
                             || z <  prob_domain.lo(2)
                             || z >= roundoff_hi_d[2]);
#endif
    return outside;
}